

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

TestRole __thiscall testing::internal::NoExecDeathTest::AssumeRole(NoExecDeathTest *this)

{
  ostream *poVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  __pid_t _Var4;
  TestRole TVar5;
  size_t sVar6;
  int *piVar7;
  long *plVar8;
  long *plVar9;
  size_type *psVar10;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  char *pcVar12;
  long lVar13;
  int pipe_fd [2];
  string local_140;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_120;
  long local_118;
  long local_110;
  long lStack_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  int local_80;
  int local_7c;
  string local_78;
  int local_54;
  string local_50;
  
  sVar6 = GetThreadCount();
  if (sVar6 != 1) {
    GTestLog::GTestLog((GTestLog *)&local_e0,GTEST_WARNING,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/todo-group[P]lattice/build_O3/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                       ,0x450);
    Message::Message((Message *)&local_120);
    poVar1 = (ostream *)(local_120._M_head_impl + 0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"Death tests use fork(), which is unsafe particularly",0x34);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1," in a threaded context. For this test, ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Google Test",0xb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    if (sVar6 == 0) {
      lVar13 = 0x26;
      pcVar12 = "couldn\'t detect the number of threads.";
    }
    else {
      lVar13 = 9;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"detected ",9);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      pcVar12 = " threads.";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar12,lVar13);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,
               " See https://github.com/google/googletest/blob/main/docs/advanced.md#death-tests-and-threads"
               ,0x5c);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1," for more explanation and suggested solutions, especially if",0x3c);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1," this is the last message you see before your test times out.",0x3d);
    StringStreamToString(&local_140,local_120._M_head_impl);
    if (local_120._M_head_impl != (stringstream *)0x0) {
      (**(code **)(*(long *)local_120._M_head_impl + 8))(local_120._M_head_impl);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,local_140._M_dataplus._M_p,local_140._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    GTestLog::~GTestLog((GTestLog *)&local_e0);
  }
  iVar3 = pipe(&local_80);
  if (iVar3 != -1) {
    paVar2 = &local_140.field_2;
    local_140._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"");
    std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
    fflush((FILE *)0x0);
    _Var4 = fork();
    if (_Var4 != -1) {
      *(__pid_t *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x3c = _Var4;
      if (_Var4 == 0) {
        while( true ) {
          iVar3 = close(local_80);
          if (iVar3 != -1) break;
          piVar7 = __errno_location();
          if (*piVar7 != 4) {
            local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_78,"CHECK failed: File ","");
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_78);
            local_c0 = (long *)*plVar8;
            plVar9 = plVar8 + 2;
            if (local_c0 == plVar9) {
              local_b0 = *plVar9;
              lStack_a8 = plVar8[3];
              local_c0 = &local_b0;
            }
            else {
              local_b0 = *plVar9;
            }
            local_b8 = plVar8[1];
            *plVar8 = (long)plVar9;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_c0);
            local_100._M_dataplus._M_p = (pointer)*plVar8;
            psVar10 = (size_type *)(plVar8 + 2);
            if ((size_type *)local_100._M_dataplus._M_p == psVar10) {
              local_100.field_2._M_allocated_capacity = *psVar10;
              local_100.field_2._8_8_ = plVar8[3];
              local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
            }
            else {
              local_100.field_2._M_allocated_capacity = *psVar10;
            }
            local_100._M_string_length = plVar8[1];
            *plVar8 = (long)psVar10;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            local_54 = 0x465;
            StreamableToString<int>(&local_50,&local_54);
            std::operator+(&local_a0,&local_100,&local_50);
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_a0);
            local_e0._M_dataplus._M_p = (pointer)*plVar8;
            psVar10 = (size_type *)(plVar8 + 2);
            if ((size_type *)local_e0._M_dataplus._M_p == psVar10) {
              local_e0.field_2._M_allocated_capacity = *psVar10;
              local_e0.field_2._8_8_ = plVar8[3];
              local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
            }
            else {
              local_e0.field_2._M_allocated_capacity = *psVar10;
            }
            local_e0._M_string_length = plVar8[1];
            *plVar8 = (long)psVar10;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_e0);
            local_120._M_head_impl =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar8;
            pbVar11 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (plVar8 + 2);
            if (local_120._M_head_impl == pbVar11) {
              local_110 = *(long *)pbVar11;
              lStack_108 = plVar8[3];
              local_120._M_head_impl =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &local_110;
            }
            else {
              local_110 = *(long *)pbVar11;
            }
            local_118 = plVar8[1];
            *plVar8 = (long)pbVar11;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_120);
            local_140._M_dataplus._M_p = (pointer)*plVar8;
            psVar10 = (size_type *)(plVar8 + 2);
            if ((size_type *)local_140._M_dataplus._M_p == psVar10) {
              local_140.field_2._M_allocated_capacity = *psVar10;
              local_140.field_2._8_8_ = plVar8[3];
              local_140._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              local_140.field_2._M_allocated_capacity = *psVar10;
            }
            local_140._M_string_length = plVar8[1];
            *plVar8 = (long)psVar10;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            DeathTestAbort(&local_140);
          }
        }
        (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = local_7c;
        UnitTest::GetInstance();
        (((UnitTest::GetInstance::instance.impl_)->listeners_).repeater_)->forwarding_enabled_ =
             false;
        g_in_fast_death_test_child = 1;
        TVar5 = EXECUTE_TEST;
      }
      else {
        while( true ) {
          iVar3 = close(local_7c);
          if (iVar3 != -1) break;
          piVar7 = __errno_location();
          if (*piVar7 != 4) {
            local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_78,"CHECK failed: File ","");
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_78);
            local_c0 = (long *)*plVar8;
            plVar9 = plVar8 + 2;
            if (local_c0 == plVar9) {
              local_b0 = *plVar9;
              lStack_a8 = plVar8[3];
              local_c0 = &local_b0;
            }
            else {
              local_b0 = *plVar9;
            }
            local_b8 = plVar8[1];
            *plVar8 = (long)plVar9;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_c0);
            local_100._M_dataplus._M_p = (pointer)*plVar8;
            psVar10 = (size_type *)(plVar8 + 2);
            if ((size_type *)local_100._M_dataplus._M_p == psVar10) {
              local_100.field_2._M_allocated_capacity = *psVar10;
              local_100.field_2._8_8_ = plVar8[3];
              local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
            }
            else {
              local_100.field_2._M_allocated_capacity = *psVar10;
            }
            local_100._M_string_length = plVar8[1];
            *plVar8 = (long)psVar10;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            local_54 = 0x471;
            StreamableToString<int>(&local_50,&local_54);
            std::operator+(&local_a0,&local_100,&local_50);
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_a0);
            local_e0._M_dataplus._M_p = (pointer)*plVar8;
            psVar10 = (size_type *)(plVar8 + 2);
            if ((size_type *)local_e0._M_dataplus._M_p == psVar10) {
              local_e0.field_2._M_allocated_capacity = *psVar10;
              local_e0.field_2._8_8_ = plVar8[3];
              local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
            }
            else {
              local_e0.field_2._M_allocated_capacity = *psVar10;
            }
            local_e0._M_string_length = plVar8[1];
            *plVar8 = (long)psVar10;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_e0);
            local_120._M_head_impl =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar8;
            pbVar11 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (plVar8 + 2);
            if (local_120._M_head_impl == pbVar11) {
              local_110 = *(long *)pbVar11;
              lStack_108 = plVar8[3];
              local_120._M_head_impl =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &local_110;
            }
            else {
              local_110 = *(long *)pbVar11;
            }
            local_118 = plVar8[1];
            *plVar8 = (long)pbVar11;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_120);
            local_140._M_dataplus._M_p = (pointer)*plVar8;
            psVar10 = (size_type *)(plVar8 + 2);
            if ((size_type *)local_140._M_dataplus._M_p == psVar10) {
              local_140.field_2._M_allocated_capacity = *psVar10;
              local_140.field_2._8_8_ = plVar8[3];
              local_140._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              local_140.field_2._M_allocated_capacity = *psVar10;
            }
            local_140._M_string_length = plVar8[1];
            *plVar8 = (long)psVar10;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            DeathTestAbort(&local_140);
          }
        }
        (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_80;
        (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
        TVar5 = OVERSEE_TEST;
      }
      return TVar5;
    }
    local_c0 = &local_b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"CHECK failed: File ","");
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_c0);
    local_100._M_dataplus._M_p = (pointer)*plVar8;
    psVar10 = (size_type *)(plVar8 + 2);
    if ((size_type *)local_100._M_dataplus._M_p == psVar10) {
      local_100.field_2._M_allocated_capacity = *psVar10;
      local_100.field_2._8_8_ = plVar8[3];
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    }
    else {
      local_100.field_2._M_allocated_capacity = *psVar10;
    }
    local_100._M_string_length = plVar8[1];
    *plVar8 = (long)psVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_100);
    local_a0._M_dataplus._M_p = (pointer)*plVar8;
    psVar10 = (size_type *)(plVar8 + 2);
    if ((size_type *)local_a0._M_dataplus._M_p == psVar10) {
      local_a0.field_2._M_allocated_capacity = *psVar10;
      local_a0.field_2._8_8_ = plVar8[3];
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    }
    else {
      local_a0.field_2._M_allocated_capacity = *psVar10;
    }
    local_a0._M_string_length = plVar8[1];
    *plVar8 = (long)psVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    local_50._M_dataplus._M_p._0_4_ = 0x462;
    StreamableToString<int>(&local_78,(int *)&local_50);
    std::operator+(&local_e0,&local_a0,&local_78);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_e0);
    local_120._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar8;
    pbVar11 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (plVar8 + 2);
    if (local_120._M_head_impl == pbVar11) {
      local_110 = *(long *)pbVar11;
      lStack_108 = plVar8[3];
      local_120._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_110;
    }
    else {
      local_110 = *(long *)pbVar11;
    }
    local_118 = plVar8[1];
    *plVar8 = (long)pbVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_140._M_dataplus._M_p = (pointer)*plVar8;
    psVar10 = (size_type *)(plVar8 + 2);
    if ((size_type *)local_140._M_dataplus._M_p == psVar10) {
      local_140.field_2._M_allocated_capacity = *psVar10;
      local_140.field_2._8_8_ = plVar8[3];
      local_140._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_140.field_2._M_allocated_capacity = *psVar10;
    }
    local_140._M_string_length = plVar8[1];
    *plVar8 = (long)psVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    DeathTestAbort(&local_140);
  }
  local_c0 = &local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"CHECK failed: File ","");
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_c0);
  local_100._M_dataplus._M_p = (pointer)*plVar8;
  psVar10 = (size_type *)(plVar8 + 2);
  if ((size_type *)local_100._M_dataplus._M_p == psVar10) {
    local_100.field_2._M_allocated_capacity = *psVar10;
    local_100.field_2._8_8_ = plVar8[3];
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  }
  else {
    local_100.field_2._M_allocated_capacity = *psVar10;
  }
  local_100._M_string_length = plVar8[1];
  *plVar8 = (long)psVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_100);
  local_a0._M_dataplus._M_p = (pointer)*plVar8;
  psVar10 = (size_type *)(plVar8 + 2);
  if ((size_type *)local_a0._M_dataplus._M_p == psVar10) {
    local_a0.field_2._M_allocated_capacity = *psVar10;
    local_a0.field_2._8_8_ = plVar8[3];
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  }
  else {
    local_a0.field_2._M_allocated_capacity = *psVar10;
  }
  local_a0._M_string_length = plVar8[1];
  *plVar8 = (long)psVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_50._M_dataplus._M_p._0_4_ = 0x454;
  StreamableToString<int>(&local_78,(int *)&local_50);
  std::operator+(&local_e0,&local_a0,&local_78);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_e0);
  local_120._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar8;
  pbVar11 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar8 + 2);
  if (local_120._M_head_impl == pbVar11) {
    local_110 = *(long *)pbVar11;
    lStack_108 = plVar8[3];
    local_120._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_110;
  }
  else {
    local_110 = *(long *)pbVar11;
  }
  local_118 = plVar8[1];
  *plVar8 = (long)pbVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_120);
  local_140._M_dataplus._M_p = (pointer)*plVar8;
  psVar10 = (size_type *)(plVar8 + 2);
  if ((size_type *)local_140._M_dataplus._M_p == psVar10) {
    local_140.field_2._M_allocated_capacity = *psVar10;
    local_140.field_2._8_8_ = plVar8[3];
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  }
  else {
    local_140.field_2._M_allocated_capacity = *psVar10;
  }
  local_140._M_string_length = plVar8[1];
  *plVar8 = (long)psVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  DeathTestAbort(&local_140);
}

Assistant:

DeathTest::TestRole NoExecDeathTest::AssumeRole() {
  const size_t thread_count = GetThreadCount();
  if (thread_count != 1) {
    GTEST_LOG_(WARNING) << DeathTestThreadWarning(thread_count);
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);

  DeathTest::set_last_death_test_message("");
  CaptureStderr();
  // When we fork the process below, the log file buffers are copied, but the
  // file descriptors are shared.  We flush all log files here so that closing
  // the file descriptors in the child process doesn't throw off the
  // synchronization between descriptors and buffers in the parent process.
  // This is as close to the fork as possible to avoid a race condition in case
  // there are multiple threads running before the death test, and another
  // thread writes to the log file.
  FlushInfoLog();

  const pid_t child_pid = fork();
  GTEST_DEATH_TEST_CHECK_(child_pid != -1);
  set_child_pid(child_pid);
  if (child_pid == 0) {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[0]));
    set_write_fd(pipe_fd[1]);
    // Redirects all logging to stderr in the child process to prevent
    // concurrent writes to the log files.  We capture stderr in the parent
    // process and append the child process' output to a log.
    LogToStderr();
    // Event forwarding to the listeners of event listener API mush be shut
    // down in death test subprocesses.
    GetUnitTestImpl()->listeners()->SuppressEventForwarding(true);
    g_in_fast_death_test_child = true;
    return EXECUTE_TEST;
  } else {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
    set_read_fd(pipe_fd[0]);
    set_spawned(true);
    return OVERSEE_TEST;
  }
}